

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void find_top_colors(int *count_buf,int bit_depth,int n_colors,int16_t *top_colors)

{
  bool bVar1;
  int iVar2;
  long in_RCX;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int i_1;
  int j;
  int i;
  int n_color_count;
  ColorCount top_color_counts [8];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58 [2];
  undefined1 auStack_50 [56];
  long local_18;
  int local_10;
  undefined4 local_c;
  long local_8;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_58,0,0x40);
  local_5c = 0;
  for (local_60 = 0; local_60 < 1 << ((byte)local_c & 0x1f); local_60 = local_60 + 1) {
    if (0 < *(int *)(local_8 + (long)local_60 * 4)) {
      if (local_5c < local_10) {
        local_58[(long)local_5c * 2] = local_60;
        local_58[(long)local_5c * 2 + 1] = *(int *)(local_8 + (long)local_60 * 4);
        local_5c = local_5c + 1;
        if (local_5c == local_10) {
          qsort(local_58,(long)local_10,8,color_count_comp);
        }
      }
      else {
        iVar2 = local_10;
        if (local_58[(long)(local_10 + -1) * 2 + 1] < *(int *)(local_8 + (long)local_60 * 4)) {
          do {
            local_64 = iVar2 + -1;
            bVar1 = false;
            if (0 < local_64) {
              bVar1 = local_58[(long)(iVar2 + -2) * 2 + 1] < *(int *)(local_8 + (long)local_60 * 4);
            }
            iVar2 = local_64;
          } while (bVar1);
          memmove(auStack_50 + (long)local_64 * 8,local_58 + (long)local_64 * 2,
                  (long)((local_10 - local_64) + -1) << 3);
          local_58[(long)local_64 * 2] = local_60;
          local_58[(long)local_64 * 2 + 1] = *(int *)(local_8 + (long)local_60 * 4);
        }
      }
    }
  }
  for (local_68 = 0; local_68 < local_10; local_68 = local_68 + 1) {
    *(short *)(local_18 + (long)local_68 * 2) = (short)local_58[(long)local_68 * 2];
  }
  return;
}

Assistant:

static void find_top_colors(const int *const count_buf, int bit_depth,
                            int n_colors, int16_t *top_colors) {
  // Top color array, serving as a priority queue if more than n_colors are
  // found.
  struct ColorCount top_color_counts[PALETTE_MAX_SIZE] = { { 0 } };
  int n_color_count = 0;
  for (int i = 0; i < (1 << bit_depth); ++i) {
    if (count_buf[i] > 0) {
      if (n_color_count < n_colors) {
        // Keep adding to the top colors.
        top_color_counts[n_color_count].index = i;
        top_color_counts[n_color_count].count = count_buf[i];
        ++n_color_count;
        if (n_color_count == n_colors) {
          qsort(top_color_counts, n_colors, sizeof(top_color_counts[0]),
                color_count_comp);
        }
      } else {
        // Check the worst in the sorted top.
        if (count_buf[i] > top_color_counts[n_colors - 1].count) {
          int j = n_colors - 1;
          // Move up to the best one.
          while (j >= 1 && count_buf[i] > top_color_counts[j - 1].count) --j;
          memmove(top_color_counts + j + 1, top_color_counts + j,
                  (n_colors - j - 1) * sizeof(top_color_counts[0]));
          top_color_counts[j].index = i;
          top_color_counts[j].count = count_buf[i];
        }
      }
    }
  }
  assert(n_color_count == n_colors);

  for (int i = 0; i < n_colors; ++i) {
    top_colors[i] = top_color_counts[i].index;
  }
}